

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *p)

{
  Options *options;
  pointer pSVar1;
  pointer piVar2;
  undefined1 *puVar3;
  Descriptor *desc;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> _Var4;
  int *piVar5;
  Printer *pPVar6;
  MessageGenerator *pMVar7;
  MessageGenerator *this_00;
  bool bVar8;
  FileOptions_OptimizeMode FVar9;
  FieldDescriptor *field;
  FieldGenerator *this_01;
  undefined1 split;
  long lVar10;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Span<const_google::protobuf::io::Printer::Sub> vars_02;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t_1;
  Iterator __begin3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v_1;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __end3;
  Printer *local_6f8;
  MessageGenerator *local_6f0;
  undefined1 local_6e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  __index_type local_6b8;
  undefined7 uStack_6b7;
  pointer piStack_6b0;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_6a8;
  size_type local_6a0;
  undefined1 local_698;
  undefined7 uStack_697;
  undefined8 uStack_690;
  pointer local_688;
  pointer local_680;
  undefined1 local_678 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  local_658;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [32];
  undefined1 local_5e8 [16];
  string local_5d8 [8];
  undefined8 local_5d0;
  undefined1 local_5c8 [24];
  undefined1 local_5b0 [32];
  byte local_590 [8];
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  undefined1 local_568 [16];
  string local_558 [16];
  __index_type local_548 [8];
  _Alloc_hider _Stack_540;
  undefined1 local_538 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [24];
  code *local_4e0;
  undefined1 local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  undefined1 local_4b0 [80];
  undefined1 local_460 [56];
  code *local_428;
  __index_type local_420;
  _Alloc_hider local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  bool local_3f8;
  bool local_3b0;
  __index_type *local_3a8;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_3a0;
  __index_type local_398 [8];
  pointer piStack_390;
  undefined8 *local_388;
  undefined8 uStack_380;
  code *local_378;
  code *local_370;
  undefined1 local_368;
  undefined1 *local_360;
  undefined8 local_358;
  undefined1 local_350 [16];
  undefined1 local_340;
  undefined1 local_2f8;
  int *local_2f0;
  pointer local_2e8;
  int local_2e0 [2];
  _Alloc_hider _Stack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  code *local_2c0;
  code *local_2b8;
  undefined1 local_2b0;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288;
  undefined1 local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 uStack_210;
  code *local_208;
  code *local_200;
  undefined1 local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [16];
  undefined1 local_1d0;
  undefined1 local_188;
  string local_180;
  string local_160;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_140;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_128;
  Iterator local_110;
  Options local_100;
  
  options = &this->options_;
  local_6f8 = p;
  bVar8 = ShouldGenerateClass(this->descriptor_,options);
  pPVar6 = local_6f8;
  if (bVar8) {
    desc = this->descriptor_;
    Options::Options(&local_100,options);
    anon_unknown_0::ClassVars
              ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)local_518,desc,&local_100);
    vars.len_ = ((long)(local_518._8_8_ - local_518._0_8_) >> 3) * -0x2c8590b21642c859;
    vars.ptr_ = (pointer)local_518._0_8_;
    io::Printer::WithDefs(&local_128,pPVar6,vars,false);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)local_518);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~raw_hash_set(&local_100.field_listener_options.forbidden_field_listener_events.
                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.annotation_guard_name._M_dataplus._M_p !=
        &local_100.annotation_guard_name.field_2) {
      operator_delete(local_100.annotation_guard_name._M_dataplus._M_p,
                      local_100.annotation_guard_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.annotation_pragma_name._M_dataplus._M_p !=
        &local_100.annotation_pragma_name.field_2) {
      operator_delete(local_100.annotation_pragma_name._M_dataplus._M_p,
                      local_100.annotation_pragma_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.runtime_include_base._M_dataplus._M_p !=
        &local_100.runtime_include_base.field_2) {
      operator_delete(local_100.runtime_include_base._M_dataplus._M_p,
                      local_100.runtime_include_base.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.dllexport_decl._M_dataplus._M_p != &local_100.dllexport_decl.field_2) {
      operator_delete(local_100.dllexport_decl._M_dataplus._M_p,
                      local_100.dllexport_decl.field_2._M_allocated_capacity + 1);
    }
    pPVar6 = local_6f8;
    MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_518,this->descriptor_,options);
    vars_00.len_ = ((long)(local_518._8_8_ - local_518._0_8_) >> 3) * -0x2c8590b21642c859;
    vars_00.ptr_ = (pointer)local_518._0_8_;
    io::Printer::WithDefs(&local_140,pPVar6,vars_00,false);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)local_518);
    pPVar6 = local_6f8;
    local_6f0 = this;
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) == '\x01') {
      local_658._16_8_ = (pointer)local_638;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)local_678 + 0x30),"annotate_accessors","");
      local_518._0_8_ = local_508;
      if ((pointer)local_658._16_8_ == (pointer)local_638) {
        local_508._8_8_ = local_638._8_8_;
      }
      else {
        local_518._0_8_ = local_658._16_8_;
      }
      local_518._8_8_ = local_658._24_8_;
      local_658._24_8_ = (pointer)0x0;
      local_638[0] = '\0';
      local_658._16_8_ = (pointer)local_638;
      local_4f8._0_8_ = operator_new(0x18);
      *(MessageGenerator **)local_4f8._0_8_ = this;
      *(Printer ***)(local_4f8._0_8_ + 8) = &local_6f8;
      *(undefined1 *)(local_4f8._0_8_ + 0x10) = 0;
      local_4e0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_4f8._8_8_ = 0;
      local_4f8._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_4d8 = '\x01';
      local_4d0._M_allocated_capacity = (size_type)&local_4c0;
      local_4d0._8_8_ = 0;
      local_4c0._M_local_buf[0] = '\0';
      local_4b0[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)&local_4d0,0,(char *)0x0,0x36a4ec);
      local_4b0[0x48] = 0;
      _Var4 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
              ((long)local_678 + 0x20);
      local_668._M_allocated_capacity = (size_type)_Var4;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_678 + 0x10),"verify","");
      local_460._0_8_ = (long)local_460 + 0x10;
      if ((_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
          local_668._M_allocated_capacity == _Var4) {
        local_460._24_8_ = local_658._8_8_;
      }
      else {
        local_460._0_8_ = local_668._M_allocated_capacity;
      }
      local_460._8_8_ = local_668._8_8_;
      local_668._8_8_ = 0;
      local_658._M_first._M_storage._M_storage[0] = '\0';
      local_668._M_allocated_capacity = (size_type)_Var4;
      local_460._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_460._32_8_ = this;
      *(Printer ***)(local_460._32_8_ + 8) = &local_6f8;
      *(undefined1 *)(local_460._32_8_ + 0x10) = 0;
      local_428 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_460._40_8_ = 0;
      local_460._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_420 = '\x01';
      local_418._M_p = (pointer)&local_408;
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      local_3f8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_418,0,(char *)0x0,0x36a4ec);
      local_3b0 = false;
      local_558._0_8_ = local_548;
      std::__cxx11::string::_M_construct<char_const*>(local_558,"class_data","");
      local_3a8 = local_398;
      if ((__index_type *)local_558._0_8_ == local_548) {
        piStack_390 = (pointer)_Stack_540._M_p;
      }
      else {
        local_3a8 = (__index_type *)local_558._0_8_;
      }
      local_3a0 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
                  local_558._8_8_;
      local_558[8] = (string)0x0;
      local_558[9] = (string)0x0;
      local_558[10] = (string)0x0;
      local_558[0xb] = (string)0x0;
      local_558[0xc] = (string)0x0;
      local_558[0xd] = (string)0x0;
      local_558[0xe] = (string)0x0;
      local_558[0xf] = (string)0x0;
      local_548[0] = '\0';
      local_558._0_8_ = local_548;
      local_388 = (undefined8 *)operator_new(0x18);
      *local_388 = local_6f0;
      local_388[1] = &local_6f8;
      *(undefined1 *)(local_388 + 2) = 0;
      local_370 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      uStack_380 = 0;
      local_378 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_368 = 1;
      local_360 = local_350;
      local_358 = 0;
      local_350[0] = 0;
      local_340 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_360,0,(char *)0x0,0x36a4ec);
      local_2f8 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar6,local_518,3,0x22d,
                 "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n              $classname$::$classname$() : SuperType(_class_data_.base()) {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena)\n                  : SuperType(arena, _class_data_.base()) {}\n#else   // PROTOBUF_CUSTOM_VTABLE\n              $classname$::$classname$() : SuperType() {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}\n#endif  // PROTOBUF_CUSTOM_VTABLE\n              $annotate_accessors$;\n              $verify$;\n              $class_data$;\n            "
                );
      pMVar7 = local_6f0;
      lVar10 = 0x228;
      do {
        if (local_518[lVar10 + -8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_568 + lVar10 + 8));
        }
        if ((long *)(local_588 + lVar10 + 0x10) != *(long **)(local_588 + lVar10)) {
          operator_delete(*(long **)(local_588 + lVar10),*(long *)(local_588 + lVar10 + 0x10) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[local_590[lVar10]]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_5b0 + lVar10));
        local_590[lVar10] = 0xff;
        if ((long *)(local_5c8 + lVar10 + 8) != *(long **)((long)&local_5d0 + lVar10)) {
          operator_delete(*(long **)((long)&local_5d0 + lVar10),
                          *(long *)(local_5c8 + lVar10 + 8) + 1);
        }
        lVar10 = lVar10 + -0xb8;
      } while (lVar10 != 0);
      if ((__index_type *)local_558._0_8_ != local_548) {
        operator_delete((void *)local_558._0_8_,CONCAT71(local_548._1_7_,local_548[0]) + 1);
      }
      if (local_668._M_allocated_capacity != (long)local_678 + 0x20U) {
        operator_delete((void *)local_668._M_allocated_capacity,
                        CONCAT71(local_658._1_7_,local_658._M_first._M_storage._M_storage[0]) + 1);
      }
      if ((pointer)local_658._16_8_ != (pointer)local_638) {
        operator_delete((void *)local_658._16_8_,CONCAT71(local_638._1_7_,local_638[0]) + 1);
      }
      ParseFunctionGenerator::GenerateDataDefinitions
                ((pMVar7->parse_function_generator_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                 ._M_head_impl,local_6f8);
    }
    else {
      bVar8 = IsAnyMessage(this->descriptor_);
      pPVar6 = local_6f8;
      if (bVar8) {
        pSVar1 = (pointer)(local_588 + 0x20);
        local_578._M_allocated_capacity = (size_type)pSVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_588 + 0x10),"any_field_descriptor","");
        if ((pointer)local_578._M_allocated_capacity == pSVar1) {
          local_508._8_8_ = local_568._8_8_;
          local_518._0_8_ = (pointer)local_508;
        }
        else {
          local_518._0_8_ = local_578._M_allocated_capacity;
        }
        local_508._1_7_ = local_568._1_7_;
        local_508[0] = local_568[0];
        local_518._8_8_ = local_578._8_8_;
        local_578._8_8_ = (pointer)0x0;
        local_568[0] = '\0';
        local_578._M_allocated_capacity = (size_type)pSVar1;
        local_4f8._0_8_ = operator_new(0x18);
        *(MessageGenerator **)local_4f8._0_8_ = this;
        *(Printer ***)(local_4f8._0_8_ + 8) = &local_6f8;
        *(undefined1 *)(local_4f8._0_8_ + 0x10) = 0;
        local_4e0 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
        local_4f8._8_8_ = 0;
        local_4f8._16_8_ =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
        local_4d8 = 1;
        local_4d0._8_8_ = 0;
        local_4c0._M_local_buf[0] = '\0';
        local_4b0[0] = '\0';
        local_4d0._M_allocated_capacity = (size_type)&local_4c0;
        std::__cxx11::string::_M_replace((ulong)&local_4d0,0,(char *)0x0,0x36a4ec);
        local_4b0[0x48] = '\0';
        google::protobuf::io::Printer::Emit
                  (pPVar6,local_518,1,0x12a,
                   "\n              $any_field_descriptor$;\n              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,\n                                                std::string* full_type_name) {\n                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);\n              }\n            "
                  );
        if (local_4b0[0x48] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_4b0 + 8));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_allocated_capacity != &local_4c0) {
          operator_delete((void *)local_4d0._M_allocated_capacity,
                          CONCAT71(local_4c0._M_allocated_capacity._1_7_,local_4c0._M_local_buf[0])
                          + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_4d8]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)local_4f8);
        local_4d8 = 0xff;
        if ((pointer)local_518._0_8_ != (pointer)local_508) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_508._0_8_ + 1));
        }
        if ((pointer)local_578._M_allocated_capacity != pSVar1) {
          operator_delete((void *)local_578._M_allocated_capacity,
                          CONCAT71(local_568._1_7_,local_568[0]) + 1);
        }
      }
      pPVar6 = local_6f8;
      local_5b0._24_8_ = (pointer)local_588;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_5b0 + 0x18),"has_bit","");
      local_518._0_8_ = local_508;
      if ((pointer)local_5b0._24_8_ == (pointer)local_588) {
        local_508._8_8_ = local_588._8_8_;
      }
      else {
        local_518._0_8_ = local_5b0._24_8_;
      }
      local_518[8] = local_590[0];
      local_518[9] = local_590[1];
      local_518[10] = local_590[2];
      local_518[0xb] = local_590[3];
      local_518[0xc] = local_590[4];
      local_518[0xd] = local_590[5];
      local_518[0xe] = local_590[6];
      local_518[0xf] = local_590[7];
      local_590 = (byte  [8])0x0;
      local_588[0] = false;
      local_5b0._24_8_ = (pointer)local_588;
      local_4f8._0_8_ = operator_new(0x18);
      *(MessageGenerator **)local_4f8._0_8_ = this;
      *(Printer ***)(local_4f8._0_8_ + 8) = &local_6f8;
      *(undefined1 *)(local_4f8._0_8_ + 0x10) = 0;
      local_4e0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_4f8._8_8_ = 0;
      local_4f8._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_4d8 = '\x01';
      local_4d0._M_allocated_capacity = (size_type)&local_4c0;
      local_4d0._8_8_ = 0;
      local_4c0._M_local_buf[0] = '\0';
      local_4b0[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)&local_4d0,0,(char *)0x0,0x36a4ec);
      local_4b0[0x48] = 0;
      piVar2 = (pointer)(local_5b0 + 8);
      local_5c8._16_8_ = piVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_5c8 + 0x10),"oneof","");
      local_460._0_8_ = (long)local_460 + 0x10;
      if ((pointer)local_5c8._16_8_ == piVar2) {
        local_460._24_8_ = local_5b0._16_8_;
      }
      else {
        local_460._0_8_ = local_5c8._16_8_;
      }
      local_460._8_8_ = local_5b0._0_8_;
      local_5b0._0_8_ = (pointer)0x0;
      local_5b0[8] = 0;
      local_5c8._16_8_ = piVar2;
      local_460._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_460._32_8_ = this;
      *(Printer ***)(local_460._32_8_ + 8) = &local_6f8;
      *(undefined1 *)(local_460._32_8_ + 0x10) = 0;
      local_428 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_460._40_8_ = 0;
      local_460._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_420 = '\x01';
      local_418._M_p = (pointer)&local_408;
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      local_3f8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_418,0,(char *)0x0,0x36a4ec);
      local_3b0 = false;
      local_5d8 = (string  [8])local_5c8;
      std::__cxx11::string::_M_construct<char_const*>(local_5d8,"required","");
      local_3a8 = local_398;
      if (local_5d8 == (string  [8])local_5c8) {
        piStack_390 = (pointer)local_5c8._8_8_;
      }
      else {
        local_3a8 = (__index_type *)local_5d8;
      }
      local_3a0 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
                  local_5d0;
      local_5d0 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)0x0;
      local_5c8[0] = 0;
      local_5d8 = (string  [8])local_5c8;
      local_388 = (undefined8 *)operator_new(0x18);
      *local_388 = local_6f0;
      local_388[1] = &local_6f8;
      *(undefined1 *)(local_388 + 2) = 0;
      local_370 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      uStack_380 = 0;
      local_378 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_368 = 1;
      local_360 = local_350;
      local_358 = 0;
      local_350[0] = 0;
      local_340 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_360,0,(char *)0x0,0x36a4ec);
      local_2f8 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar6,local_518,3,0x88,
                 "\n        class $classname$::_Internal {\n         public:\n          $has_bit$;\n          $oneof$;\n          $required$;\n        };\n      "
                );
      lVar10 = 0x228;
      do {
        if (local_518[lVar10 + -8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_568 + lVar10 + 8));
        }
        if ((long *)(local_588 + lVar10 + 0x10) != *(long **)(local_588 + lVar10)) {
          operator_delete(*(long **)(local_588 + lVar10),*(long *)(local_588 + lVar10 + 0x10) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[local_590[lVar10]]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_5b0 + lVar10));
        local_590[lVar10] = 0xff;
        if ((long *)(local_5c8 + lVar10 + 8) != *(long **)((long)&local_5d0 + lVar10)) {
          operator_delete(*(long **)((long)&local_5d0 + lVar10),
                          *(long *)(local_5c8 + lVar10 + 8) + 1);
        }
        lVar10 = lVar10 + -0xb8;
      } while (lVar10 != 0);
      if (local_5d8 != (string  [8])local_5c8) {
        operator_delete((void *)local_5d8,CONCAT71(local_5c8._1_7_,local_5c8[0]) + 1);
      }
      pMVar7 = local_6f0;
      if ((pointer)local_5c8._16_8_ != piVar2) {
        operator_delete((void *)local_5c8._16_8_,CONCAT71(local_5b0._9_7_,local_5b0[8]) + 1);
      }
      if ((pointer)local_5b0._24_8_ != (pointer)local_588) {
        operator_delete((void *)local_5b0._24_8_,CONCAT71(local_588._1_7_,local_588[0]) + 1);
      }
      google::protobuf::io::Printer::Emit(local_6f8,0,0,1);
      local_5e8._8_8_ = pMVar7->descriptor_;
      local_5e8._0_4_ = 0;
      local_110.idx = *(int *)(local_5e8._8_8_ + 4);
      local_110.descriptor = (Descriptor *)local_5e8._8_8_;
      while( true ) {
        bVar8 = protobuf::internal::operator==((Iterator *)local_5e8,&local_110);
        this_00 = local_6f0;
        if (bVar8) break;
        field = Descriptor::field((Descriptor *)local_5e8._8_8_,local_5e8._0_4_);
        pPVar6 = local_6f8;
        FieldVars((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)local_6e8,field,options);
        vars_01.len_ = ((long)(local_6e8._8_8_ - local_6e8._0_8_) >> 3) * -0x2c8590b21642c859;
        vars_01.ptr_ = (pointer)local_6e8._0_8_;
        io::Printer::WithDefs
                  ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_518,pPVar6,vars_01,false);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)local_6e8);
        pPVar6 = local_6f8;
        MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                          *)local_538,field,options);
        vars_02.len_ = ((long)(local_538._8_8_ - local_538._0_8_) >> 3) * -0x2c8590b21642c859;
        vars_02.ptr_ = (pointer)local_538._0_8_;
        io::Printer::WithDefs
                  ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_6e8,pPVar6,vars_02,false);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)local_538);
        this_01 = FieldGeneratorTable::get(&pMVar7->field_generators_,field);
        FieldGenerator::GenerateNonInlineAccessorDefinitions(this_01,local_6f8);
        bVar8 = anon_unknown_0::IsCrossFileMaybeMap(field);
        if (bVar8) {
          GenerateFieldClear(local_6f0,field,false,local_6f8);
        }
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_6e8);
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
                    *)local_518);
        local_5e8._0_4_ = local_5e8._0_4_ + 1;
      }
      GenerateStructors(local_6f0,local_6f8);
      split = 0xc6;
      google::protobuf::io::Printer::Emit(local_6f8,0,0,1);
      if (0 < *(int *)(this_00->descriptor_ + 0x7c)) {
        GenerateOneofClear(this_00,local_6f8);
        split = 0xc6;
        google::protobuf::io::Printer::Emit(local_6f8,0,0,1);
      }
      GenerateClassData(this_00,local_6f8);
      ParseFunctionGenerator::GenerateDataDefinitions
                ((this_00->parse_function_generator_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                 ._M_head_impl,local_6f8);
      FVar9 = GetOptimizeFor(*(FileDescriptor **)(this_00->descriptor_ + 0x10),options,(bool *)0x0);
      if (FVar9 != FileOptions_OptimizeMode_CODE_SIZE) {
        GenerateClear(this_00,local_6f8);
        google::protobuf::io::Printer::Emit(local_6f8,0,0,1,"\n");
        GenerateSerializeWithCachedSizesToArray(this_00,local_6f8);
        google::protobuf::io::Printer::Emit(local_6f8,0,0,1,"\n");
        GenerateByteSize(this_00,local_6f8);
        google::protobuf::io::Printer::Emit(local_6f8,0,0,1,"\n");
        GenerateClassSpecificMergeImpl(this_00,local_6f8);
        google::protobuf::io::Printer::Emit(local_6f8,0,0,1,"\n");
        GenerateCopyFrom(this_00,local_6f8);
        google::protobuf::io::Printer::Emit(local_6f8,0,0,1,"\n");
        GenerateIsInitialized(this_00,local_6f8);
        split = 0xc6;
        google::protobuf::io::Printer::Emit(local_6f8,0,0,1);
      }
      bVar8 = ShouldSplit(this_00->descriptor_,options);
      pPVar6 = local_6f8;
      if (bVar8) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"split_default","");
        DefaultInstanceName_abi_cxx11_
                  ((string *)local_6e8,(cpp *)this_00->descriptor_,(Descriptor *)options,
                   (Options *)0x1,(bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>
                  ((Sub *)local_518,&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"default","");
        DefaultInstanceName_abi_cxx11_
                  ((string *)local_538,(cpp *)this_00->descriptor_,(Descriptor *)options,
                   (Options *)0x0,(bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>
                  ((Sub *)local_460,&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538);
        google::protobuf::io::Printer::Emit
                  (pPVar6,local_518,2,0x1ae,
                   "\n              void $classname$::PrepareSplitMessageForWrite() {\n                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {\n                  void* chunk = $pbi$::CreateSplitMessageGeneric(\n                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,\n                      &$default$);\n                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);\n                }\n              }\n            "
                  );
        lVar10 = 0x170;
        do {
          if (local_518[lVar10 + -8] == '\x01') {
            std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                      ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                       (local_568 + lVar10 + 8));
          }
          if ((long *)(local_588 + lVar10 + 0x10) != *(long **)(local_588 + lVar10)) {
            operator_delete(*(long **)(local_588 + lVar10),*(long *)(local_588 + lVar10 + 0x10) + 1)
            ;
          }
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
            ::_S_vtable._M_arr[local_590[lVar10]]._M_data)
                    ((anon_class_1_0_00000001 *)local_5e8,
                     (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                      *)(local_5b0 + lVar10));
          local_590[lVar10] = 0xff;
          if ((long *)(local_5c8 + lVar10 + 8) != *(long **)((long)&local_5d0 + lVar10)) {
            operator_delete(*(long **)((long)&local_5d0 + lVar10),
                            *(long *)(local_5c8 + lVar10 + 8) + 1);
          }
          lVar10 = lVar10 + -0xb8;
        } while (lVar10 != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,local_528._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_6e8._0_8_ != (pointer)(local_6e8 + 0x10)) {
          operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      GenerateSwap(this_00,local_6f8);
      google::protobuf::io::Printer::Emit(local_6f8,0,0,1,"\n");
      pPVar6 = local_6f8;
      local_688 = (pointer)local_678;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_688,"annotate_accessor_definition","");
      local_518._0_8_ = local_508;
      if (local_688 == (pointer)local_678) {
        local_508._8_8_ = local_678._8_8_;
      }
      else {
        local_518._0_8_ = local_688;
      }
      local_518._8_8_ = local_680;
      local_680 = (pointer)0x0;
      local_678[0] = 0;
      local_688 = (pointer)local_678;
      local_4f8._0_8_ = operator_new(0x18);
      *(MessageGenerator **)local_4f8._0_8_ = this_00;
      *(Printer ***)(local_4f8._0_8_ + 8) = &local_6f8;
      *(undefined1 *)(local_4f8._0_8_ + 0x10) = 0;
      local_4e0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_4f8._8_8_ = 0;
      local_4f8._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_4d8 = '\x01';
      local_4d0._M_allocated_capacity = (size_type)&local_4c0;
      local_4d0._8_8_ = 0;
      local_4c0._M_local_buf[0] = '\0';
      local_4b0[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)&local_4d0,0,(char *)0x0,0x36a4ec);
      local_4b0[0x48] = 0;
      local_6a8 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
                  &local_698;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"get_metadata","");
      local_460._0_8_ = (long)local_460 + 0x10;
      if (local_6a8 ==
          (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)&local_698) {
        local_460._24_8_ = uStack_690;
      }
      else {
        local_460._0_4_ = local_6a8._M_payload;
        local_460[4] = local_6a8._M_engaged;
        local_460._5_3_ = local_6a8._5_3_;
      }
      local_460._8_8_ = local_6a0;
      local_6a0 = 0;
      local_698 = 0;
      local_6a8 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
                  &local_698;
      local_460._32_8_ = operator_new(0x18);
      *(MessageGenerator **)local_460._32_8_ = this_00;
      *(Printer ***)(local_460._32_8_ + 8) = &local_6f8;
      *(undefined1 *)(local_460._32_8_ + 0x10) = 0;
      local_428 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_460._40_8_ = 0;
      local_460._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_420 = '\x01';
      local_418._M_p = (pointer)&local_408;
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      local_3f8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_418,0,(char *)0x0,0x36a4ec);
      local_3b0 = false;
      local_6c8._M_allocated_capacity = (size_type)&local_6b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"post_loop_handler","");
      local_3a8 = local_398;
      if ((__index_type *)local_6c8._M_allocated_capacity == &local_6b8) {
        piStack_390 = piStack_6b0;
      }
      else {
        local_3a8 = (__index_type *)local_6c8._M_allocated_capacity;
      }
      local_3a0._M_payload =
           (_Storage<google::protobuf::io::AnnotationCollector::Semantic,_true>)local_6c8._8_4_;
      local_3a0._M_engaged = (bool)local_6c8._M_local_buf[0xc];
      local_3a0._5_3_ = local_6c8._13_3_;
      local_6c8._8_8_ = 0;
      local_6b8 = '\0';
      local_6c8._M_allocated_capacity = (size_type)&local_6b8;
      local_388 = (undefined8 *)operator_new(0x18);
      *local_388 = this_00;
      local_388[1] = &local_6f8;
      *(undefined1 *)(local_388 + 2) = 0;
      local_370 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      uStack_380 = 0;
      local_378 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_368 = 1;
      local_360 = local_350;
      local_358 = 0;
      local_350[0] = 0;
      local_340 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_360,0,(char *)0x0,0x36a4ec);
      local_2f8 = 0;
      piVar5 = (int *)(local_608 + 0x10);
      local_608._0_8_ = piVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_638 + 0x30),"message_set_definition","");
      local_2f0 = local_2e0;
      if ((int *)local_608._0_8_ == piVar5) {
        _Stack_2d8._M_p = (pointer)local_608._24_8_;
      }
      else {
        local_2f0 = (int *)local_608._0_8_;
      }
      local_2e8 = (pointer)local_608._8_8_;
      local_608._8_8_ = (pointer)0x0;
      local_608[0x10] = '\0';
      local_2d0 = 0;
      uStack_2c8 = 0;
      local_2b8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_2c0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_2b0 = 1;
      local_2a8 = local_298;
      local_2a0 = 0;
      local_298[0] = 0;
      local_288 = 0;
      local_608._0_8_ = piVar5;
      std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,0x36a4ec);
      local_240 = 0;
      puVar3 = local_638 + 0x20;
      local_628._0_8_ = puVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_638 + 0x10),"tracker_decl","");
      local_238 = local_228;
      if ((undefined1 *)local_628._0_8_ == puVar3) {
        uStack_220 = local_618._8_8_;
      }
      else {
        local_238 = (undefined1 *)local_628._0_8_;
      }
      local_230 = local_628._8_8_;
      local_628._8_8_ = 0;
      local_618[0] = '\0';
      local_628._0_8_ = puVar3;
      local_218 = (undefined8 *)operator_new(0x18);
      *local_218 = local_6f0;
      local_218[1] = &local_6f8;
      *(undefined1 *)(local_218 + 2) = 0;
      local_200 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      uStack_210 = 0;
      local_208 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_1f8 = 1;
      local_1f0 = local_1e0;
      local_1e8 = 0;
      local_1e0[0] = 0;
      local_1d0 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_1f0,0,(char *)0x0,0x36a4ec);
      local_188 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar6,local_518,5,0x9e,
                 "\n        $annotate_accessor_definition$;\n        $get_metadata$;\n        $post_loop_handler$;\n        $message_set_definition$;\n        $tracker_decl$;\n      "
                );
      lVar10 = 0x398;
      do {
        if (local_518[lVar10 + -8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_568 + lVar10 + 8));
        }
        if ((long *)(local_588 + lVar10 + 0x10) != *(long **)(local_588 + lVar10)) {
          operator_delete(*(long **)(local_588 + lVar10),*(long *)(local_588 + lVar10 + 0x10) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[local_590[lVar10]]._M_data)
                  ((anon_class_1_0_00000001 *)local_6e8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_5b0 + lVar10));
        local_590[lVar10] = 0xff;
        if ((long *)(local_5c8 + lVar10 + 8) != *(long **)((long)&local_5d0 + lVar10)) {
          operator_delete(*(long **)((long)&local_5d0 + lVar10),
                          *(long *)(local_5c8 + lVar10 + 8) + 1);
        }
        lVar10 = lVar10 + -0xb8;
      } while (lVar10 != 0);
      if ((undefined1 *)local_628._0_8_ != puVar3) {
        operator_delete((void *)local_628._0_8_,CONCAT71(local_618._1_7_,local_618[0]) + 1);
      }
      if ((int *)local_608._0_8_ != piVar5) {
        operator_delete((void *)local_608._0_8_,CONCAT71(local_608._17_7_,local_608[0x10]) + 1);
      }
      if ((__index_type *)local_6c8._M_allocated_capacity != &local_6b8) {
        operator_delete((void *)local_6c8._M_allocated_capacity,CONCAT71(uStack_6b7,local_6b8) + 1);
      }
      if (local_6a8 !=
          (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)&local_698) {
        operator_delete((void *)local_6a8,CONCAT71(uStack_697,local_698) + 1);
      }
      if (local_688 != (pointer)local_678) {
        operator_delete(local_688,CONCAT71(local_678._1_7_,local_678[0]) + 1);
      }
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&local_140);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&local_128);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassMethods(io::Printer* p) {
  if (!ShouldGenerateClass(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));

  if (IsMapEntryMessage(descriptor_)) {
    p->Emit({{"annotate_accessors",
              [&] {
                if (!options_.annotate_accessor) return;
                for (auto f : FieldRange(descriptor_)) {
                  p->Emit({{"field", FieldName(f)}},
                          R"cc(
                            volatile bool $classname$::$field$_AccessedNoStrip;
                          )cc");
                }
              }},
             {"verify",
              [&] {
                // Delegates generating verify function as only a subset of map
                // entry messages need it; i.e. UTF8 string key/value or message
                // type value.
                GenerateVerify(p);
              }},
             {"class_data", [&] { GenerateClassData(p); }}},
            R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
              $classname$::$classname$() : SuperType(_class_data_.base()) {}
              $classname$::$classname$(::$proto_ns$::Arena* arena)
                  : SuperType(arena, _class_data_.base()) {}
#else   // PROTOBUF_CUSTOM_VTABLE
              $classname$::$classname$() : SuperType() {}
              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}
#endif  // PROTOBUF_CUSTOM_VTABLE
              $annotate_accessors$;
              $verify$;
              $class_data$;
            )cc");
    parse_function_generator_->GenerateDataDefinitions(p);
    return;
  }
  if (IsAnyMessage(descriptor_)) {
    p->Emit({{"any_field_descriptor",
              [&] {
                if (!HasDescriptorMethods(descriptor_->file(), options_)) {
                  return;
                }
                p->Emit(
                    R"cc(
                      bool $classname$::GetAnyFieldDescriptors(
                          const ::$proto_ns$::Message& message,
                          const ::$proto_ns$::FieldDescriptor** type_url_field,
                          const ::$proto_ns$::FieldDescriptor** value_field) {
                        return ::_pbi::GetAnyFieldDescriptors(message, type_url_field, value_field);
                      }
                    )cc");
              }}},
            R"cc(
              $any_field_descriptor$;
              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,
                                                std::string* full_type_name) {
                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);
              }
            )cc");
  }
  p->Emit(
      {{"has_bit",
        [&] {
          if (has_bit_indices_.empty()) return;
          p->Emit(
              R"cc(
                using HasBits =
                    decltype(std::declval<$classname$>().$has_bits$);
                static constexpr ::int32_t kHasBitsOffset =
                    8 * PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_);
              )cc");
        }},
       {"oneof",
        [&] {
          if (descriptor_->real_oneof_decl_count() == 0) return;
          p->Emit(
              R"cc(
                static constexpr ::int32_t kOneofCaseOffset =
                    PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$);
              )cc");
        }},
       {"required",
        [&] {
          if (num_required_fields_ == 0) return;
          const std::vector<uint32_t> masks_for_has_bits =
              RequiredFieldsBitMask();
          p->Emit(
              {{"check_bit_mask", ConditionalToCheckBitmasks(
                                      masks_for_has_bits, false, "has_bits")}},
              R"cc(
                static bool MissingRequiredFields(const HasBits& has_bits) {
                  return $check_bit_mask$;
                }
              )cc");
        }}},
      R"cc(
        class $classname$::_Internal {
         public:
          $has_bit$;
          $oneof$;
          $required$;
        };
      )cc");
  p->Emit("\n");

  // Generate non-inline field definitions.
  for (auto field : FieldRange(descriptor_)) {
    auto v = p->WithVars(FieldVars(field, options_));
    auto t = p->WithVars(MakeTrackerCalls(field, options_));
    field_generators_.get(field).GenerateNonInlineAccessorDefinitions(p);
    if (IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, false, p);
    }
  }

  GenerateStructors(p);
  p->Emit("\n");

  if (descriptor_->real_oneof_decl_count() > 0) {
    GenerateOneofClear(p);
    p->Emit("\n");
  }

  GenerateClassData(p);
  parse_function_generator_->GenerateDataDefinitions(p);

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(p);
    p->Emit("\n");

    GenerateSerializeWithCachedSizesToArray(p);
    p->Emit("\n");

    GenerateByteSize(p);
    p->Emit("\n");

    GenerateClassSpecificMergeImpl(p);
    p->Emit("\n");

    GenerateCopyFrom(p);
    p->Emit("\n");

    GenerateIsInitialized(p);
    p->Emit("\n");
  }

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"split_default",
              DefaultInstanceName(descriptor_, options_, /*split=*/true)},
             {"default",
              DefaultInstanceName(descriptor_, options_, /*split=*/false)}},
            R"cc(
              void $classname$::PrepareSplitMessageForWrite() {
                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {
                  void* chunk = $pbi$::CreateSplitMessageGeneric(
                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,
                      &$default$);
                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);
                }
              }
            )cc");
  }

  GenerateVerify(p);

  GenerateSwap(p);
  p->Emit("\n");

  p->Emit(
      {{"annotate_accessor_definition",
        [&] {
          if (!options_.annotate_accessor) return;
          for (auto f : FieldRange(descriptor_)) {
            p->Emit({{"field", FieldName(f)}},
                    R"cc(
                      volatile bool $classname$::$field$_AccessedNoStrip;
                    )cc");
          }
        }},
       {"get_metadata",
        [&] {
          if (!HasDescriptorMethods(descriptor_->file(), options_)) return;
          // Same as the base class, but it avoids virtual dispatch.
          p->Emit(R"cc(
            ::$proto_ns$::Metadata $classname$::GetMetadata() const {
              return $superclass$::GetMetadataImpl(GetClassData()->full());
            }
          )cc");
        }},
       {"post_loop_handler",
        [&] {
          if (!NeedsPostLoopHandler(descriptor_, options_)) return;
          p->Emit({{"required",
                    [&] {
                    }}},
                  R"cc(
                    const char* $classname$::PostLoopHandler(
                        MessageLite* msg, const char* ptr,
                        ::_pbi::ParseContext* ctx) {
                      $classname$* _this = static_cast<$classname$*>(msg);
                      $annotate_deserialize$;
                      $required$;
                      return ptr;
                    }
                  )cc");
        }},
       {"message_set_definition",
        [&] {
        }},
       {"tracker_decl",
        [&] {
          if (!HasTracker(descriptor_, options_)) return;
          p->Emit(R"cc(
            ::$proto_ns$::AccessListener<$classtype$> $classname$::$tracker$(
                &FullMessageName);
          )cc");
        }}},
      R"cc(
        $annotate_accessor_definition$;
        $get_metadata$;
        $post_loop_handler$;
        $message_set_definition$;
        $tracker_decl$;
      )cc");
}